

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

exr_result_t update_chunk_offsets(exr_context_t ctxt,_internal_exr_seq_scratch *scratch)

{
  long lVar1;
  int32_t iVar2;
  long in_RSI;
  long in_RDI;
  exr_priv_part_t in_stack_00000008;
  int in_stack_0000001c;
  exr_priv_part_t in_stack_00000020;
  exr_context_t in_stack_00000028;
  int32_t ccount;
  int p;
  exr_result_t rv;
  exr_priv_part_t prevpart;
  exr_priv_part_t curpart;
  char *local_70;
  char *local_50;
  int local_30;
  exr_result_t local_2c;
  long local_28;
  exr_result_t local_4;
  
  local_2c = 0;
  if (*(long *)(in_RDI + 0x1d8) == 0) {
    local_4 = 3;
  }
  else {
    *(long *)(**(long **)(in_RDI + 0x1d8) + 0xf8) =
         *(long *)(in_RSI + 0x18) - *(long *)(in_RSI + 0x10);
    local_28 = **(long **)(in_RDI + 0x1d8);
    for (local_30 = 0; local_30 < *(int *)(in_RDI + 0xc4); local_30 = local_30 + 1) {
      lVar1 = *(long *)(*(long *)(in_RDI + 0x1d8) + (long)local_30 * 8);
      local_2c = internal_exr_compute_tile_information
                           (in_stack_00000028,in_stack_00000020,in_stack_0000001c);
      if (local_2c != 0) break;
      iVar2 = internal_exr_compute_chunk_offset_size(in_stack_00000008);
      if (iVar2 < 0) {
        if (*(long *)(lVar1 + 0x68) == 0) {
          local_50 = "<first>";
        }
        else {
          local_50 = *(char **)(*(long *)(*(long *)(lVar1 + 0x68) + 0x18) + 8);
        }
        local_2c = (**(code **)(in_RDI + 0x48))
                             (in_RDI,0xe,"Invalid chunk count (%d) for part \'%s\'",iVar2,local_50);
        break;
      }
      if (*(int *)(lVar1 + 0xf4) < 0) {
        *(int32_t *)(lVar1 + 0xf4) = iVar2;
      }
      else if (*(int *)(lVar1 + 0xf4) != iVar2) {
        if (*(long *)(lVar1 + 0x68) == 0) {
          local_70 = "<first>";
        }
        else {
          local_70 = *(char **)(*(long *)(*(long *)(lVar1 + 0x68) + 0x18) + 8);
        }
        (**(code **)(in_RDI + 0x48))
                  (in_RDI,0xe,"Invalid chunk count (%d) for part \'%s\' (%d), expect (%d)",
                   *(undefined4 *)(lVar1 + 0xf4),local_70,local_30,iVar2);
        *(int32_t *)(lVar1 + 0xf4) = iVar2;
      }
      if (local_28 != lVar1) {
        *(long *)(lVar1 + 0xf8) = *(long *)(local_28 + 0xf8) + (long)*(int *)(local_28 + 0xf4) * 8;
      }
      local_28 = lVar1;
    }
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

static exr_result_t
update_chunk_offsets (
    exr_context_t ctxt, struct _internal_exr_seq_scratch* scratch)
{
    exr_priv_part_t curpart, prevpart;

    exr_result_t rv = EXR_ERR_SUCCESS;

    if (!ctxt->parts) return EXR_ERR_INVALID_ARGUMENT;

    ctxt->parts[0]->chunk_table_offset =
        scratch->fileoff - (uint64_t) scratch->navail;
    prevpart = ctxt->parts[0];

    for (int p = 0; p < ctxt->num_parts; ++p)
    {
        int32_t ccount;

        curpart = ctxt->parts[p];

        rv = internal_exr_compute_tile_information (ctxt, curpart, 0);
        if (rv != EXR_ERR_SUCCESS) break;

        ccount = internal_exr_compute_chunk_offset_size (curpart);
        if (ccount < 0)
        {
            rv = ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ATTR,
                "Invalid chunk count (%d) for part '%s'",
                ccount,
                (curpart->name ? curpart->name->string->str : "<first>"));
            break;
        }

        if (curpart->chunk_count < 0)
            curpart->chunk_count = ccount;
        else if (curpart->chunk_count != ccount)
        {
            /* fatal error or just ignore it? c++ seemed to just ignore it entirely, we can at least warn */
            /* rv = */
            ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ATTR,
                "Invalid chunk count (%d) for part '%s' (%d), expect (%d)",
                curpart->chunk_count,
                (curpart->name ? curpart->name->string->str : "<first>"),
                p,
                ccount);
            curpart->chunk_count = ccount;
        }
        if (prevpart != curpart)
            curpart->chunk_table_offset =
                prevpart->chunk_table_offset +
                sizeof (uint64_t) * (size_t) (prevpart->chunk_count);
        prevpart = curpart;
    }
    return rv;
}